

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

mz_bool duckdb_miniz::mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  byte bVar1;
  byte bVar2;
  mz_zip_internal_state *pmVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  mz_bool mVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  short *psVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  mz_zip_error mVar21;
  mz_uint8 *pCentral_dir_header;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  mz_uint8 descriptor_buf [32];
  mz_uint32 uncomp_crc32;
  mz_bool found_zip64_ext_data_in_cdir;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  ulong local_518;
  uint local_508;
  ulong local_500;
  short *local_4f8;
  uint local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  ulong local_4c8;
  uint local_4c0 [3];
  byte local_4b2;
  uint local_4aa;
  uint local_4a6;
  uint local_4a2;
  ushort local_49e;
  ushort local_49c;
  mz_uint64 local_498;
  ulong local_490;
  long local_488;
  mz_zip_archive_file_stat local_480;
  
  local_4c0[1] = 0;
  local_4c0[0] = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if ((((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
LAB_011dfb89:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_011dfb89;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar3->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar10 = mz_zip_file_stat_internal
                     (pZip,file_index,pCentral_dir_header,&local_480,(mz_bool *)(local_4c0 + 1));
  if (mVar10 == 0) {
    return 0;
  }
  if (local_480.m_is_directory != 0) {
    return 1;
  }
  if (local_480.m_uncomp_size == 0) {
    return 1;
  }
  if (local_480.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((local_480.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (local_480.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_480.m_local_header_ofs,local_4c0 + 2,0x1e);
  if (sVar13 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_4c0[2] != 0x4034b50) {
LAB_011dfcd4:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar22 = (ulong)local_49e;
  local_508 = (uint)local_49c;
  local_500 = (ulong)local_4a6;
  local_4c8 = (ulong)local_4a2;
  sVar14 = strlen(local_480.m_filename);
  if (sVar14 != uVar22) goto LAB_011dfcd4;
  local_498 = uVar22 + local_480.m_local_header_ofs + 0x1e;
  local_490 = (ulong)local_508;
  local_488 = local_498 + local_490;
  if (pZip->m_archive_size < local_480.m_comp_size + local_488) goto LAB_011dfcd4;
  uVar15 = (ulong)local_508;
  if (local_508 < local_49e) {
    uVar15 = uVar22;
  }
  if ((int)uVar15 == 0) {
    local_4f8 = (short *)0x0;
  }
  else {
    local_4f8 = (short *)(*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(void *)0x0,1,uVar15);
    if (local_4f8 == (short *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
  }
  if (uVar22 == 0) {
LAB_011dfda3:
    uVar22 = local_490;
    if ((local_508 != 0) && ((local_4a6 == 0xffffffff || ((int)local_4c8 == -1)))) {
      sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_498,local_4f8,local_490);
      psVar17 = local_4f8;
      if (sVar13 != uVar22) goto LAB_011e00db;
      do {
        if (local_508 < 4) goto LAB_011dfcd4;
        uVar20 = (ushort)psVar17[1] + 4;
        if (local_508 < uVar20) goto LAB_011dfcd4;
        if (*psVar17 == 1) {
          if ((ushort)psVar17[1] < 0x10) {
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            goto LAB_011e01b0;
          }
          local_4c8 = *(ulong *)(psVar17 + 2);
          local_500 = *(ulong *)(psVar17 + 6);
          bVar28 = true;
          goto LAB_011dfdc7;
        }
        local_508 = local_508 - uVar20;
        psVar17 = (short *)((long)psVar17 + (ulong)uVar20);
      } while (local_508 != 0);
    }
    bVar28 = false;
LAB_011dfdc7:
    if ((((local_4b2 & 8) != 0) && (local_500 == 0)) && (local_4aa == 0)) {
      sVar13 = 0x18;
      if (!bVar28) {
        sVar13 = (ulong)(pmVar3->m_zip64 != 0) * 8 + 0x10;
      }
      sVar16 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488 + local_480.m_comp_size,&local_4e8,
                                sVar13);
      mVar21 = MZ_ZIP_FILE_READ_FAILED;
      if (sVar16 == sVar13) {
        bVar27 = local_4e8 != 0x8074b50;
        uVar23 = local_4e4 >> 8 & 0xff;
        uVar20 = local_4e4;
        if (!bVar27) {
          uVar20 = local_4e0;
        }
        uVar18 = local_4e0 >> 8 & 0xff;
        uVar24 = uVar23;
        if (!bVar27) {
          uVar24 = uVar18;
        }
        bVar1 = local_4e0._2_1_;
        if (bVar27) {
          bVar1 = local_4e4._2_1_;
        }
        bVar2 = local_4e0._3_1_;
        if (bVar27) {
          bVar2 = local_4e4._3_1_;
        }
        uVar4 = local_4e0;
        if (!bVar27) {
          uVar4 = local_4dc;
        }
        uVar12 = (uint)local_4dc._1_1_;
        if (bVar27) {
          uVar12 = uVar18;
        }
        uVar18 = local_4e8 >> 0x18;
        if (local_4e8 == 0x8074b50) {
          uVar18 = (uint)local_4e4._3_1_;
        }
        uVar5 = local_4e8 >> 0x10;
        if (local_4e8 == 0x8074b50) {
          uVar5 = (uint)local_4e4._2_1_;
        }
        uVar26 = local_4e8 >> 8;
        uVar7 = local_4e8;
        if (local_4e8 == 0x8074b50) {
          uVar26 = uVar23;
          uVar7 = local_4e4;
        }
        local_518 = (ulong)((uint)bVar2 << 0x18 | (uint)bVar1 << 0x10 | uVar24 << 8 | uVar20 & 0xff)
        ;
        if ((bool)(~bVar28 & pmVar3->m_zip64 == 0)) {
          puVar8 = &local_4e0;
          if (local_4e8 == 0x8074b50) {
            puVar8 = &local_4dc;
          }
          puVar9 = &local_4e0;
          if (local_4e8 == 0x8074b50) {
            puVar9 = &local_4dc;
          }
          uVar22 = (ulong)((uint)*(byte *)((long)puVar9 + 3) << 0x18 |
                          (uint)*(byte *)((long)puVar8 + 2) << 0x10 | uVar12 << 8) +
                   (ulong)(uVar4 & 0xff);
        }
        else {
          bVar28 = local_4e8 == 0x8074b50;
          if (bVar28) {
            local_4e0._2_1_ = local_4dc._2_1_;
          }
          uVar22 = (ulong)local_4e0._3_1_;
          uVar20 = local_4dc >> 0x18;
          uVar23 = local_4dc;
          if (bVar28) {
            uVar22 = (ulong)uVar20;
            uVar23 = local_4d8;
          }
          if (bVar28) {
            local_4dc._1_1_ = local_4d8._1_1_;
          }
          uVar19 = local_4d8 >> 0x10 & 0xff;
          uVar24 = (uint)local_4dc._2_1_;
          if (bVar28) {
            uVar24 = uVar19;
          }
          uVar6 = local_4d8;
          if (bVar28) {
            uVar6 = local_4d4;
            uVar20 = local_4d8 >> 0x18;
          }
          bVar1 = local_4d4._1_1_;
          if (!bVar28) {
            bVar1 = local_4d8._1_1_;
          }
          uVar25 = local_4d4 >> 0x10 & 0xff;
          if (!bVar28) {
            uVar25 = uVar19;
          }
          local_4c8 = (ulong)local_4d4._3_1_;
          if (!bVar28) {
            local_4c8 = (ulong)(local_4d8 >> 0x18);
          }
          local_518 = local_518 +
                      ((ulong)(uVar4 & 0xff) << 0x20 | (ulong)uVar12 << 0x28 |
                       (ulong)local_4e0._2_1_ << 0x30 | uVar22 << 0x38);
          uVar22 = CONCAT44(uVar6,uVar20 << 0x18 |
                                  uVar24 << 0x10 | (uint)local_4dc._1_1_ << 8 | uVar23 & 0xff) &
                   0xffffffffff | (ulong)bVar1 << 0x28 | (ulong)uVar25 << 0x30 | local_4c8 << 0x38;
        }
        mVar21 = MZ_ZIP_VALIDATION_FAILED;
        if ((((uVar18 << 0x18 | (uVar5 & 0xff) << 0x10 | (uVar26 & 0xff) << 8 | uVar7 & 0xff) ==
              local_480.m_crc32) && (local_518 == local_480.m_comp_size)) &&
           (uVar22 == local_480.m_uncomp_size)) goto LAB_011e0155;
      }
      pZip->m_last_error = mVar21;
      goto LAB_011e01b0;
    }
    if (((local_4aa == local_480.m_crc32) && (local_500 == local_480.m_comp_size)) &&
       (local_4c8 == local_480.m_uncomp_size)) {
LAB_011e0155:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4f8);
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar10 = mz_zip_reader_extract_to_callback
                         (pZip,file_index,mz_zip_compute_crc32_callback,local_4c0,0);
      if (mVar10 == 0) {
        return 0;
      }
      if (local_4c0[0] != local_480.m_crc32) {
        pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
        return 0;
      }
      return 1;
    }
  }
  else {
    sVar13 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_480.m_local_header_ofs + 0x1e,local_4f8,
                              uVar22);
    if (sVar13 != uVar22) {
LAB_011e00db:
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_011e01b0;
    }
    iVar11 = bcmp(local_480.m_filename,local_4f8,uVar22);
    if (iVar11 == 0) goto LAB_011dfda3;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_011e01b0:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4f8);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;
    mz_zip_internal_state *pState;
    const mz_uint8 *pCentral_dir_header;
    mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint64 local_header_ofs = 0;
    mz_uint32 local_header_filename_len, local_header_extra_len, local_header_crc32;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
    mz_bool has_data_descriptor;
    mz_uint32 local_header_bit_flags;

    mz_zip_array file_data_array;
    mz_zip_array_init(&file_data_array, 1);

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (file_index > pZip->m_total_files)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

    if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header, &file_stat, &found_zip64_ext_data_in_cdir))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_is_encrypted)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports stored and deflate. */
    if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    if (!file_stat.m_is_supported)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    /* Read and parse the local directory entry. */
    local_header_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    local_header_filename_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
    local_header_bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    has_data_descriptor = (local_header_bit_flags & 8) != 0;

    if (local_header_filename_len != strlen(file_stat.m_filename))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (!mz_zip_array_resize(pZip, &file_data_array, MZ_MAX(local_header_filename_len, local_header_extra_len), MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (local_header_filename_len)
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE, file_data_array.m_p, local_header_filename_len) != local_header_filename_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        /* I've seen 1 archive that had the same pathname, but used backslashes in the local dir and forward slashes in the central dir. Do we care about this? For now, this case will fail validation. */
        if (memcmp(file_stat.m_filename, file_data_array.m_p, local_header_filename_len) != 0)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_uint32 extra_size_remaining = local_header_extra_len;
        const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                    goto handle_failure;
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    /* TODO: parse local header extra data when local_header_comp_size is 0xFFFFFFFF! (big_descriptor.zip) */
    /* I've seen zips in the wild with the data descriptor bit set, but proper local header values and bogus data descriptors */
    if ((has_data_descriptor) && (!local_header_comp_size) && (!local_header_crc32))
    {
        mz_uint8 descriptor_buf[32];
        mz_bool has_id;
        const mz_uint8 *pSrc;
        mz_uint32 file_crc32;
        mz_uint64 comp_size = 0, uncomp_size = 0;

        mz_uint32 num_descriptor_uint32s = ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size, descriptor_buf, sizeof(mz_uint32) * num_descriptor_uint32s) != (sizeof(mz_uint32) * num_descriptor_uint32s))
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
        pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

        file_crc32 = MZ_READ_LE32(pSrc);

        if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
        }
        else
        {
            comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
        }

        if ((file_crc32 != file_stat.m_crc32) || (comp_size != file_stat.m_comp_size) || (uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }
    else
    {
        if ((local_header_crc32 != file_stat.m_crc32) || (local_header_comp_size != file_stat.m_comp_size) || (local_header_uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    mz_zip_array_clear(pZip, &file_data_array);

    if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0)
    {
        if (!mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
            return MZ_FALSE;

        /* 1 more check to be sure, although the extract checks too. */
        if (uncomp_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            return MZ_FALSE;
        }
    }

    return MZ_TRUE;

handle_failure:
    mz_zip_array_clear(pZip, &file_data_array);
    return MZ_FALSE;
}